

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  char_type buffer [26];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_58;
  char local_48 [40];
  
  uVar5 = *(ulong *)this;
  iVar1 = *(int *)(this + 8);
  lVar8 = (long)iVar1;
  pcVar3 = local_48 + lVar8;
  uVar6 = uVar5;
  if (99 < uVar5) {
    do {
      uVar5 = uVar6 / 100;
      *(undefined2 *)(pcVar3 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar6 + (int)uVar5 * -100) * 2)
      ;
      pcVar3 = pcVar3 + -2;
      bVar2 = 9999 < uVar6;
      uVar6 = uVar5;
    } while (bVar2);
  }
  local_58._M_stream = it->_M_stream;
  local_58._M_string = it->_M_string;
  if (uVar5 < 10) {
    bVar4 = (byte)uVar5 | 0x30;
    lVar7 = -1;
  }
  else {
    pcVar3[-1] = internal::basic_data<void>::DIGITS[(uVar5 * 2 & 0xffffffff) + 1];
    bVar4 = internal::basic_data<void>::DIGITS[uVar5 * 2 & 0x1fffffffe];
    lVar7 = -2;
  }
  pcVar3[lVar7] = bVar4;
  if (0 < iVar1) {
    pcVar3 = local_48;
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,pcVar3);
      pcVar3 = pcVar3 + 1;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  it->_M_stream = local_58._M_stream;
  it->_M_string = local_58._M_string;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }